

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O1

Var __thiscall
Js::RegexHelper::RegexEs5ReplaceImpl
          (RegexHelper *this,ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
          JavascriptString *input,RecyclableObject *replacefn)

{
  size_t size;
  char16 c;
  RegexPattern *this_00;
  Var nonMatchValue;
  long lVar1;
  code *pcVar2;
  undefined8 this_01;
  Type TVar3;
  Type input_00;
  uint uVar4;
  charcount_t cVar5;
  bool isGlobal;
  bool bVar6;
  uint16 uVar7;
  Attributes attributes;
  char16 *input_01;
  undefined4 *puVar8;
  StaticType *type;
  JavascriptString *input_02;
  GroupInfo GVar9;
  Var pvVar10;
  uint64 uVar11;
  uint64 uVar12;
  Type TVar13;
  JavascriptMethod p_Var14;
  RecyclableObject *ptr;
  Type TVar15;
  Type TVar16;
  CharCount CVar17;
  Type TVar18;
  ulong uVar19;
  void *pvVar20;
  ThreadContext *pTVar21;
  uint uVar22;
  GroupInfo GVar23;
  ulong uVar24;
  Type ppvVar25;
  ushort uVar26;
  void *apvStack_320 [2];
  undefined1 local_310 [8];
  Builder<256U> concatenated;
  RegexMatchState state;
  Type local_a8;
  Arguments local_98;
  Type local_88;
  Type local_80;
  Type local_78;
  GroupInfo local_70;
  Type local_68;
  Type local_60;
  Type local_58;
  Type local_50;
  Type local_48;
  bool local_3d;
  uint local_3c;
  charcount_t local_38;
  bool local_32;
  ImplicitCallFlags local_31;
  
  this_00 = (RegexPattern *)(scriptContext->super_ScriptContextBase).pActiveScriptDirect;
  apvStack_320[0] = (void *)0xd4e317;
  local_60.word = (Type)input;
  input_01 = JavascriptString::GetString((JavascriptString *)regularExpression);
  apvStack_320[0] = (void *)0xd4e326;
  local_38 = JavascriptString::GetLength((JavascriptString *)regularExpression);
  apvStack_320[0] = (void *)0xd4e331;
  uVar7 = UnifiedRegex::RegexPattern::NumGroups(this_00);
  nonMatchValue = *(Var *)(*(long *)(this + 8) + 0x430);
  local_88.word = (Type)this_00;
  local_78.word = (Type)this;
  local_48.word = (Type)regularExpression;
  if ((short)uVar7 < 1) {
    AssertCount = AssertCount + 1;
    apvStack_320[0] = (void *)0xd4e367;
    Throw::LogAssert();
    apvStack_320[0] = (void *)0xd4e377;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    apvStack_320[0] = (void *)0xd4e39f;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x502,"(0 < numGroups && numGroups <= (32767))",
                                "0 < numGroups && numGroups <= (32767)");
    if (!bVar6) {
LAB_00d4ea8c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  TVar16.word = local_48.word;
  TVar13.word = local_78.word;
  TVar15.word = local_88.word;
  local_80.word = (Type)uVar7;
  lVar1 = *(long *)(local_78.word + 8);
  apvStack_320[0] = (void *)0xd4e3d5;
  type = StringCache::GetStringTypeStatic((StringCache *)(lVar1 + 0xfa8));
  apvStack_320[0] = (void *)0xd4e3f0;
  input_02 = &LiteralString::New(type,L"<replace function>",0x12,*(Recycler **)(lVar1 + 0x4e8))->
              super_JavascriptString;
  apvStack_320[0] = (void *)0xd4e401;
  RegexHelperTrace((ScriptContext *)TVar13.word,(Use)scriptContext,(JavascriptRegExp *)TVar16.word,
                   input_02,(JavascriptString *)replacefn);
  local_3c = 0;
  apvStack_320[0] = (void *)0xd4e424;
  PrimBeginMatch((RegexMatchState *)&concatenated.isFinalized,(ScriptContext *)TVar13.word,
                 (RegexPattern *)TVar15.word,input_01,(CharCount)replacefn,false);
  apvStack_320[0] = (void *)0xd4e42c;
  bVar6 = UnifiedRegex::RegexPattern::IsGlobal((RegexPattern *)TVar15.word);
  apvStack_320[0] = (void *)0xd4e436;
  local_3d = UnifiedRegex::RegexPattern::IsSticky((RegexPattern *)TVar15.word);
  cVar5 = local_38;
  local_32 = bVar6;
  if (bVar6) {
    scriptContext->next = (ScriptContext *)0x0;
    *(undefined4 *)&scriptContext->prev = 0;
  }
  else if (local_3d) {
    if (*(int *)&scriptContext->prev == -2) {
      apvStack_320[0] = (void *)0xd4e471;
      JavascriptRegExp::CacheLastIndex((JavascriptRegExp *)scriptContext);
    }
    local_3c = *(uint *)&scriptContext->prev;
  }
  TVar13.word = local_78.word;
  apvStack_320[0] = (void *)0xd4e496;
  CompoundString::Builder<256U>::Builder((Builder<256U> *)local_310,(ScriptContext *)local_78.word);
  TVar15.word = *(Type *)(TVar13.word + 0x3b8);
  uVar19 = (ulong)(uint)((int)local_80.word * 8);
  size = uVar19 + 0x18;
  apvStack_320[0] = (void *)0xd4e4bb;
  ThreadContext::ProbeStackNoDispose
            ((ThreadContext *)TVar15.word,size,(ScriptContext *)TVar13.word,(PVOID)0x0);
  lVar1 = -(ulong)((int)size + 0xfU & 0x1ffff0);
  ppvVar25 = (Type)((long)apvStack_320 + lVar1 + 8);
  *ppvVar25 = *(void **)(*(long *)(TVar13.word + 8) + 0x430);
  TVar16.word = local_48.word;
  *(Type *)((long)&concatenated + uVar19 + lVar1) = local_48.word;
  pTVar21 = (ThreadContext *)concatenated._520_8_;
  if (local_3c != 0) {
    CVar17 = cVar5;
    if (local_3c < cVar5) {
      CVar17 = local_3c;
    }
    if (concatenated._520_8_ == 0) {
      replacefn._0_4_ = 0;
      replacefn._4_4_ = 0;
      *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e525;
      TVar15.word = TVar16.word;
      CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                ((JavascriptString *)TVar16.word,0,CVar17,(Builder<256U> *)local_310,false);
    }
    else {
      *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e50a;
      CompoundString::Append((CompoundString *)pTVar21,(JavascriptString *)TVar16.word,0,CVar17);
      TVar15.word = (Type)pTVar21;
    }
  }
  uVar4 = local_3c;
  GVar9.length = 0;
  GVar9.offset = local_3c;
  local_a8.word = 0xffffffff00000000;
  if (cVar5 < local_3c) {
    uVar19 = 0;
    uVar24 = 0;
    local_58.word = 0xffffffff00000000;
    GVar9 = (GroupInfo)replacefn;
  }
  else {
    local_a8.word = 0xffffffff00000000;
    local_68.word = (Type)ppvVar25;
    *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e564;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    TVar3.word = local_88.word;
    TVar15.word = (Type)&concatenated.isFinalized;
    *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e580;
    GVar23 = PrimMatch((RegexMatchState *)TVar15.word,(ScriptContext *)TVar13.word,
                       (RegexPattern *)TVar3.word,cVar5,uVar4);
    local_58.word = (ulong)GVar23 >> 0x20;
    if (local_58.word == 0xffffffff) {
      uVar19 = 0;
    }
    else {
      TVar18._0_4_ = (int)local_80.word + 3U & 0xffff;
      TVar18._4_4_ = 0;
      TVar16.word = local_80.word;
      do {
        TVar13.word = local_68.word;
        TVar15.word = local_88.word;
        local_70 = GVar23;
        if (TVar16.word != 0) {
          uVar19 = 0;
          do {
            *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e5de;
            GVar9 = UnifiedRegex::RegexPattern::GetGroup((RegexPattern *)TVar15.word,(int)uVar19);
            input_00.word = local_48.word;
            TVar3.word = local_78.word;
            *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e5f1;
            pvVar10 = GetString((ScriptContext *)TVar3.word,(JavascriptString *)input_00.word,
                                nonMatchValue,GVar9);
            ((Type)(TVar13.word + 8))[uVar19] = pvVar10;
            uVar19 = uVar19 + 1;
          } while (TVar16.word != uVar19);
        }
        uVar19 = (ulong)local_70 & 0xffffffff;
        if ((int)local_70.offset < 0) {
          local_50.word = (Type)(double)uVar19;
          *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e639;
          uVar11 = NumberUtilities::ToSpecial((double)uVar19);
          TVar15.word = local_50.word;
          *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e646;
          bVar6 = NumberUtilities::IsNan((double)TVar15.word);
          TVar3.word = local_50.word;
          TVar15.word = local_68.word;
          TVar13.word = local_78.word;
          TVar16.word = local_80.word;
          if (bVar6) {
            *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e660;
            uVar12 = NumberUtilities::ToSpecial((double)TVar3.word);
            TVar3.word = local_50.word;
            if (uVar12 != 0xfff8000000000000) {
              *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e679;
              uVar12 = NumberUtilities::ToSpecial((double)TVar3.word);
              if (uVar12 != 0x7ff8000000000000) {
                AssertCount = AssertCount + 1;
                *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e696;
                Throw::LogAssert();
                *puVar8 = 1;
                *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e6c4;
                bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                            ,0xa2,
                                            "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                            ,"We should only produce a NaN with this value");
                if (!bVar6) goto LAB_00d4ea8c;
                *puVar8 = 0;
              }
            }
          }
          pvVar20 = (void *)(uVar11 ^ 0xfffc000000000000);
        }
        else {
          pvVar20 = (void *)(uVar19 | 0x1000000000000);
          TVar13.word = local_78.word;
          TVar16.word = local_80.word;
          TVar15.word = local_68.word;
        }
        TVar3.word = local_60.word;
        *(void **)(TVar15.word + (TVar16.word + 1) * 8) = pvVar20;
        pTVar21 = *(ThreadContext **)
                   ((((ThreadContext *)TVar13.word)->backgroundPageQueue).
                    backgroundPageQueueCriticalSection.super_CCLock.mutexPtr + 0x38);
        local_50.word._0_1_ = pTVar21->reentrancySafeOrHandled;
        pTVar21->reentrancySafeOrHandled = true;
        *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e716;
        attributes = FunctionInfo::GetAttributes((RecyclableObject *)TVar3.word);
        *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e725;
        bVar6 = ThreadContext::HasNoSideEffect(pTVar21,(RecyclableObject *)TVar3.word,attributes);
        TVar3.word = local_60.word;
        TVar15.word = local_68.word;
        uVar26 = (ushort)TVar16.word;
        if (bVar6) {
          *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e735;
          p_Var14 = RecyclableObject::GetEntryPoint((RecyclableObject *)TVar3.word);
          TVar15.word = local_60.word;
          if (0xfffc < uVar26) {
            *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4ea8c;
            ::Math::DefaultOverflowPolicy();
          }
          local_98.Values = (Type)local_68.word;
          local_98.Info = TVar18;
          *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e76e;
          ptr = (RecyclableObject *)
                JavascriptFunction::CallFunction<true>
                          ((RecyclableObject *)TVar15.word,p_Var14,&local_98,false);
          *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e779;
          bVar6 = ThreadContext::IsOnStack(ptr);
LAB_00d4e779:
          if (bVar6 != false) {
            pTVar21->implicitCallFlags = pTVar21->implicitCallFlags | ImplicitCall_Accessor;
          }
        }
        else if ((pTVar21->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag)
        {
          if ((attributes & HasNoSideEffect) != None) {
            *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e8f3;
            p_Var14 = RecyclableObject::GetEntryPoint((RecyclableObject *)TVar3.word);
            TVar3.word = local_60.word;
            if (0xfffc < uVar26) {
              *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4ea93;
              ::Math::DefaultOverflowPolicy();
            }
            local_98.Values = (Type)TVar15.word;
            local_98.Info = TVar18;
            *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e928;
            ptr = (RecyclableObject *)
                  JavascriptFunction::CallFunction<true>
                            ((RecyclableObject *)TVar3.word,p_Var14,&local_98,false);
            *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e933;
            bVar6 = ThreadContext::IsOnStack(ptr);
            goto LAB_00d4e779;
          }
          local_31 = pTVar21->implicitCallFlags;
          *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e7bc;
          p_Var14 = RecyclableObject::GetEntryPoint((RecyclableObject *)TVar3.word);
          TVar3.word = local_60.word;
          if (0xfffc < uVar26) {
            *(undefined1 **)((long)apvStack_320 + lVar1) = &LAB_00d4ea98;
            ::Math::DefaultOverflowPolicy();
          }
          local_98.Values = (Type)TVar15.word;
          local_98.Info = TVar18;
          *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e7f1;
          ptr = (RecyclableObject *)
                JavascriptFunction::CallFunction<true>
                          ((RecyclableObject *)TVar3.word,p_Var14,&local_98,false);
          pTVar21->implicitCallFlags = local_31 | ImplicitCall_Accessor;
        }
        else {
          pTVar21->implicitCallFlags = pTVar21->implicitCallFlags | ImplicitCall_Accessor;
          ptr = (((((((((Type *)(local_60.word + 8))->ptr->javascriptLibrary).ptr)->
                    super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                 javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
        }
        pTVar21->reentrancySafeOrHandled = local_50.word._0_1_;
        *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e83f;
        TVar15.word = (Type)JavascriptConversion::ToString(ptr,TVar13.word);
        uVar4 = local_3c;
        TVar3.word = local_48.word;
        GVar9 = local_70;
        this_01 = concatenated._520_8_;
        uVar22 = local_70.offset;
        CVar17 = uVar22 - local_3c;
        if (concatenated._520_8_ == 0) {
          *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e87c;
          CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                    ((JavascriptString *)TVar3.word,uVar4,CVar17,(Builder<256U> *)local_310,false);
        }
        else {
          *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e863;
          CompoundString::Append
                    ((CompoundString *)this_01,(JavascriptString *)TVar3.word,uVar4,CVar17);
        }
        pTVar21 = (ThreadContext *)concatenated._520_8_;
        if (concatenated._520_8_ == 0) {
          *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e8a3;
          CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                    ((JavascriptString *)TVar15.word,(Builder<256U> *)local_310,false);
        }
        else {
          *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e890;
          CompoundString::Append((CompoundString *)pTVar21,(JavascriptString *)TVar15.word);
          TVar15.word = (Type)pTVar21;
        }
        TVar3.word = local_88.word;
        pTVar21 = (ThreadContext *)concatenated._520_8_;
        if ((ulong)GVar9 >> 0x20 == 0) {
          if (uVar22 < local_38) {
            c = input_01[uVar19];
            if (concatenated._520_8_ == 0) {
              TVar15.word = (Type)(ushort)c;
              *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e948;
              CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                        (c,(Builder<256U> *)local_310,false);
            }
            else {
              *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e8df;
              CompoundString::Append((CompoundString *)pTVar21,c);
              TVar15.word = (Type)pTVar21;
            }
          }
          uVar22 = uVar22 + 1;
        }
        else {
          uVar22 = (int)local_58.word + uVar22;
        }
        cVar5 = local_38;
        GVar9.length = 0;
        GVar9.offset = uVar22;
        GVar23 = local_70;
        local_3c = uVar22;
        if (local_32 == false) break;
        if (local_38 < uVar22) {
          local_58.word = 0xffffffff;
          break;
        }
        TVar15.word = (Type)&concatenated.isFinalized;
        *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e970;
        GVar23 = PrimMatch((RegexMatchState *)TVar15.word,(ScriptContext *)TVar13.word,
                           (RegexPattern *)TVar3.word,cVar5,uVar22);
        local_58.word = (ulong)GVar23 >> 0x20;
      } while (local_58.word != 0xffffffff);
      local_a8.word = (ulong)local_70 & 0xffffffff00000000;
      uVar19 = (ulong)local_70 & 0xffffffff;
      TVar16.word = local_48.word;
    }
    local_58.word = local_58.word << 0x20;
    uVar24 = (ulong)GVar23 & 0xffffffff;
  }
  uVar4 = local_3c;
  if (state.input != (char16 *)0x0) {
    *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4e9dc;
    TVar15.word = TVar13.word;
    ScriptContext::ReleaseTemporaryAllocator
              ((ScriptContext *)TVar13.word,(TempArenaAllocatorObject *)state.input);
    TVar16.word = local_48.word;
  }
  TVar3.word = local_48.word;
  if (uVar4 != 0) {
    bVar6 = uVar4 <= local_38;
    CVar17 = local_38 - uVar4;
    local_38 = CVar17;
    if (bVar6 && CVar17 != 0) {
      if (concatenated._520_8_ == 0) {
        GVar9.offset = 0;
        GVar9.length = 0;
        *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4ea2a;
        CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                  ((JavascriptString *)TVar3.word,uVar4,CVar17,(Builder<256U> *)local_310,false);
      }
      else {
        *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4ea10;
        CompoundString::Append
                  ((CompoundString *)concatenated._520_8_,(JavascriptString *)TVar3.word,uVar4,
                   CVar17);
      }
    }
    TVar15.word = (Type)local_310;
    *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4ea36;
    TVar16.word = (Type)CompoundString::Builder<256U>::ToString((Builder<256U> *)TVar15.word);
  }
  isGlobal = local_32;
  bVar6 = local_3d;
  GVar23 = (GroupInfo)(local_58.word | uVar24);
  *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4ea60;
  PropagateLastMatchToRegex
            ((ScriptContext *)TVar15.word,isGlobal,bVar6,(JavascriptRegExp *)scriptContext,GVar9,
             GVar23);
  TVar15.word = local_48.word;
  *(undefined8 *)((long)apvStack_320 + lVar1) = 0xd4ea75;
  PropagateLastMatchToCtor
            ((ScriptContext *)TVar13.word,(JavascriptRegExp *)scriptContext,
             (JavascriptString *)TVar15.word,(GroupInfo)(local_a8.word | uVar19),false);
  return (ThreadContext *)TVar16.word;
}

Assistant:

Var RegexHelper::RegexEs5ReplaceImpl(ScriptContext* scriptContext, JavascriptRegExp* regularExpression, JavascriptString* input, RecyclableObject* replacefn)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();
        JavascriptString* newString = nullptr;
        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength();
        const uint16 numGroups = pattern->NumGroups();
        Var nonMatchValue = NonMatchValue(scriptContext, false);
        UnifiedRegex::GroupInfo lastMatch; // initially undefined

        // Regex parser should ensure this condition holds, but let's be doubly sure.
        // numGroups is always positive because the entire regex counts as a capturing group.
        AssertOrFailFast(0 < numGroups && numGroups <= INT16_MAX);

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Replace, regularExpression, input, scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("<replace function>")));
#endif

        RegexMatchState state;
        PrimBeginMatch(state, scriptContext, pattern, inputStr, inputLength, false);

        // NOTE: These must be kept out of the scope of the try below!
        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();

        // If global = true, set lastIndex to 0 in case it is used in replacefn
        if (isGlobal)
        {
            regularExpression->SetLastIndex(0);
        }

        // If global = false and sticky = true, set offset = lastIndex, else set offset = 0
        CharCount offset = 0;
        if (!isGlobal && isSticky)
        {
            offset = regularExpression->GetLastIndex();
        }

        CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)> concatenated(scriptContext);
        UnifiedRegex::GroupInfo lastActualMatch;
        UnifiedRegex::GroupInfo lastSuccessfulMatch;

        // Replace function must be called with arguments (<function's this>, group0, ..., groupn, offset, input)
        // The garbage collector must know about this array since it is being passed back into script land
        Var* replaceArgs;
        PROBE_STACK_NO_DISPOSE(scriptContext, (numGroups + 3) * sizeof(Var));
        replaceArgs = (Var*)_alloca((numGroups + 3) * sizeof(Var));
        replaceArgs[0] = scriptContext->GetLibrary()->GetUndefined();
        replaceArgs[numGroups + 2] = input;

        if (offset > 0)
        {
            concatenated.Append(input, 0, min(offset, inputLength));
        }

        do
        {
            if (offset > inputLength)
            {
                lastActualMatch.Reset();
                break;
            }

            lastActualMatch = PrimMatch(state, scriptContext, pattern, inputLength, offset);

            if (lastActualMatch.IsUndefined())
                break;

            lastSuccessfulMatch = lastActualMatch;
            for (int groupId = 0;  groupId < numGroups; groupId++)
                replaceArgs[groupId + 1] = GetGroup(scriptContext, pattern, input, nonMatchValue, groupId);
            replaceArgs[numGroups + 1] = JavascriptNumber::ToVar(lastActualMatch.offset, scriptContext);

            // The called function must see the global state updated by the current match
            // (Should the function reach into a RegExp field, the pattern will still be valid, thus there's no
            //  danger of the primitive regex matcher being re-entered)

            // WARNING: We go off into script land here, which way in turn invoke a regex operation, even on the
            //          same regex.

            ThreadContext* threadContext = scriptContext->GetThreadContext();
            Var replaceVar = threadContext->ExecuteImplicitCall(replacefn, ImplicitCall_Accessor, [=]()->Js::Var
            {
                    return JavascriptFunction::CallFunction<true>(replacefn, replacefn->GetEntryPoint(), Arguments(CallInfo(UInt16Math::Add(numGroups, 3)), replaceArgs));
            });
            JavascriptString* replace = JavascriptConversion::ToString(replaceVar, scriptContext);
            concatenated.Append(input, offset, lastActualMatch.offset - offset);
            concatenated.Append(replace);

            if (lastActualMatch.length == 0)
            {
                if (lastActualMatch.offset < inputLength)
                {
                    concatenated.Append(inputStr[lastActualMatch.offset]);
                }
                offset = lastActualMatch.offset + 1;
            }
            else
            {
                offset = lastActualMatch.EndOffset();
            }
        }
        while (isGlobal);

        PrimEndMatch(state, scriptContext, pattern);

        if (offset == 0)
        {
            // There was no successful match so the result is the input string.
            newString = input;
        }
        else
        {
            if (offset < inputLength)
            {
                concatenated.Append(input, offset, inputLength - offset);
            }
            newString = concatenated.ToString();
        }

        PropagateLastMatch(scriptContext, isGlobal, isSticky, regularExpression, input, lastSuccessfulMatch, lastActualMatch, true, true);
        return newString;
    }